

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int simpleCreate(int argc,char **argv,sqlite3_tokenizer **ppTokenizer)

{
  int iVar1;
  sqlite3_tokenizer *__s;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  __s = (sqlite3_tokenizer *)sqlite3_malloc(0x88);
  if (__s == (sqlite3_tokenizer *)0x0) {
    iVar1 = 7;
  }
  else {
    uVar5 = 0;
    memset(__s,0,0x88);
    if (argc < 2) {
      lVar4 = 0;
      while (lVar4 != 0x7f) {
        *(char *)((long)&__s[1].pModule + lVar4 + 1) =
             -(((uint)(lVar4 + 1) & 0x5f) - 0x5b < 0xffffffe6 && (int)lVar4 - 0x39U < 0xfffffff6);
        lVar4 = lVar4 + 1;
      }
    }
    else {
      sVar2 = strlen(argv[1]);
      uVar3 = sVar2 & 0xffffffff;
      if ((int)sVar2 < 1) {
        uVar3 = uVar5;
      }
      for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
        if ((long)argv[1][uVar5] < 0) {
          sqlite3_free(__s);
          return 1;
        }
        *(undefined1 *)((long)&__s[1].pModule + (long)argv[1][uVar5]) = 1;
      }
    }
    *ppTokenizer = __s;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int simpleCreate(
  int argc, const char * const *argv,
  sqlite3_tokenizer **ppTokenizer
){
  simple_tokenizer *t;

  t = (simple_tokenizer *) sqlite3_malloc(sizeof(*t));
  if( t==NULL ) return SQLITE_NOMEM;
  memset(t, 0, sizeof(*t));

  /* TODO(shess) Delimiters need to remain the same from run to run,
  ** else we need to reindex.  One solution would be a meta-table to
  ** track such information in the database, then we'd only want this
  ** information on the initial create.
  */
  if( argc>1 ){
    int i, n = (int)strlen(argv[1]);
    for(i=0; i<n; i++){
      unsigned char ch = argv[1][i];
      /* We explicitly don't support UTF-8 delimiters for now. */
      if( ch>=0x80 ){
        sqlite3_free(t);
        return SQLITE_ERROR;
      }
      t->delim[ch] = 1;
    }
  } else {
    /* Mark non-alphanumeric ASCII characters as delimiters */
    int i;
    for(i=1; i<0x80; i++){
      t->delim[i] = !fts3_isalnum(i) ? -1 : 0;
    }
  }

  *ppTokenizer = &t->base;
  return SQLITE_OK;
}